

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_k_ol2.c
# Opt level: O0

void gga_k_ol2_init(xc_func_type *p)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  gga_k_ol2_params *params;
  
  pvVar2 = malloc(0x18);
  in_RDI[0x2f] = pvVar2;
  puVar1 = (undefined8 *)in_RDI[0x2f];
  if (*(int *)*in_RDI == 0x201) {
    *puVar1 = 0x3ff0000000000000;
    puVar1[1] = 0x3fcc156f06f638bf;
    puVar1[2] = 0x3f9fa25203faad75;
  }
  return;
}

Assistant:

static void
gga_k_ol2_init(xc_func_type *p)
{
  gga_k_ol2_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_k_ol2_params));
  params = (gga_k_ol2_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_K_OL2:
    params->aa = 1.0;
    params->bb = 1.0/K_FACTOR_C;
    params->cc = 0.0887*M_CBRT4/K_FACTOR_C;
    break;
  }
}